

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_vector_dense.cpp
# Opt level: O2

void __thiscall
test_vector_dense_constructors_initialiser_lists_Test::TestBody
          (test_vector_dense_constructors_initialiser_lists_Test *this)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  _func_int **pp_Var4;
  DeathTest *pDVar5;
  initializer_list<double> local_e0;
  DeathTest *gtest_dt;
  AssertionResult gtest_ar;
  Vector_Dense<double,_3UL> static_vector;
  ReturnSentinel gtest_sentinel;
  Vector_Dense<double,_0UL> dynamic_vector;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_68;
  Vector_Dense<double,_4UL> local_50;
  
  static_vector.super_array<double,_3UL>._M_elems[0] = (double)&gtest_ar;
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0x3ff00000000000;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )&DAT_4008000000000000;
  static_vector.super_array<double,_3UL>._M_elems[1] = 1.97626258336499e-323;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense
            (&dynamic_vector,(initializer_list<double> *)&static_vector);
  static_vector.super_array<double,_3UL>._M_elems[0] =
       (double)((long)dynamic_vector.super_vector<double,_std::allocator<double>_>.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)dynamic_vector.super_vector<double,_std::allocator<double>_>.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3);
  local_e0._M_array = (iterator)CONCAT44(local_e0._M_array._4_4_,4);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"dynamic_vector.size()","4",(unsigned_long *)&static_vector,
             (int *)&local_e0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&static_vector);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0x23,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e0,(Message *)&static_vector);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e0);
    if (static_vector.super_array<double,_3UL>._M_elems[0] != 0.0) {
      (**(code **)(*(long *)static_vector.super_array<double,_3UL>._M_elems[0] + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar,"dynamic_vector[0]","1.0",
             *dynamic_vector.super_vector<double,_std::allocator<double>_>.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start,1.0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&static_vector);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0x24,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e0,(Message *)&static_vector);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e0);
    if (static_vector.super_array<double,_3UL>._M_elems[0] != 0.0) {
      (**(code **)(*(long *)static_vector.super_array<double,_3UL>._M_elems[0] + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar,"dynamic_vector[1]","3.0",
             dynamic_vector.super_vector<double,_std::allocator<double>_>.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[1],3.0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&static_vector);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0x25,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e0,(Message *)&static_vector);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e0);
    if (static_vector.super_array<double,_3UL>._M_elems[0] != 0.0) {
      (**(code **)(*(long *)static_vector.super_array<double,_3UL>._M_elems[0] + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar,"dynamic_vector[2]","4.0",
             dynamic_vector.super_vector<double,_std::allocator<double>_>.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[2],4.0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&static_vector);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0x26,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e0,(Message *)&static_vector);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e0);
    if (static_vector.super_array<double,_3UL>._M_elems[0] != 0.0) {
      (**(code **)(*(long *)static_vector.super_array<double,_3UL>._M_elems[0] + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar,"dynamic_vector[3]","-8.0",
             dynamic_vector.super_vector<double,_std::allocator<double>_>.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[3],-8.0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&static_vector);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0x27,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e0,(Message *)&static_vector);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e0);
    if (static_vector.super_array<double,_3UL>._M_elems[0] != 0.0) {
      (**(code **)(*(long *)static_vector.super_array<double,_3UL>._M_elems[0] + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0xc0410000000000;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x404c000000000000;
  local_e0._M_len = 3;
  local_e0._M_array = (iterator)&gtest_ar;
  Disa::Vector_Dense<double,_3UL>::Vector_Dense(&static_vector,&local_e0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar,"static_vector[0]","-34.0",
             static_vector.super_array<double,_3UL>._M_elems[0],-34.0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_e0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0x2a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if ((AssertionResult *)local_e0._M_array != (AssertionResult *)0x0) {
      (**(code **)((long)*local_e0._M_array + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar,"static_vector[1]","56.0",
             static_vector.super_array<double,_3UL>._M_elems[1],56.0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_e0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0x2b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if ((AssertionResult *)local_e0._M_array != (AssertionResult *)0x0) {
      (**(code **)((long)*local_e0._M_array + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar,"static_vector[2]","23.0",
             static_vector.super_array<double,_3UL>._M_elems[2],23.0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_e0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0x2c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if ((AssertionResult *)local_e0._M_array != (AssertionResult *)0x0) {
      (**(code **)((long)*local_e0._M_array + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_((char *)gtest_dt);
    bVar1 = testing::internal::DeathTest::Create
                      ("(Vector_Dense<Scalar, 4>({-34.0, 56.0, 23.0}))",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_68,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
                       ,0x2e,&gtest_dt);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_68);
    pDVar5 = gtest_dt;
    if (!bVar1) goto LAB_0010acad;
    if (gtest_dt == (DeathTest *)0x0) goto LAB_0010acff;
    iVar2 = (*gtest_dt->_vptr_DeathTest[2])(gtest_dt);
    if (iVar2 == 0) {
      iVar2 = (*gtest_dt->_vptr_DeathTest[3])(gtest_dt);
      bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
      iVar2 = (*gtest_dt->_vptr_DeathTest[4])(gtest_dt,(ulong)bVar1);
      if ((char)iVar2 == '\0') {
        (*pDVar5->_vptr_DeathTest[1])(pDVar5);
        goto LAB_0010acad;
      }
    }
    else if (iVar2 == 1) {
      gtest_sentinel.test_ = gtest_dt;
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        gtest_ar.success_ = false;
        gtest_ar._1_7_ = 0xc0410000000000;
        gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x404c000000000000;
        local_e0._M_len = 3;
        local_e0._M_array = (iterator)&gtest_ar;
        Disa::Vector_Dense<double,_4UL>::Vector_Dense(&local_50,&local_e0);
      }
      (*gtest_dt->_vptr_DeathTest[5])(gtest_dt,2);
      testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
    }
    pp_Var4 = pDVar5->_vptr_DeathTest;
  }
  else {
LAB_0010acad:
    testing::Message::Message((Message *)&gtest_ar);
    pcVar3 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0x2e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e0,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e0);
    if (gtest_ar._0_8_ == 0) goto LAB_0010acff;
    pp_Var4 = *(_func_int ***)gtest_ar._0_8_;
    pDVar5 = (DeathTest *)gtest_ar._0_8_;
  }
  (*pp_Var4[1])(pDVar5);
LAB_0010acff:
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&dynamic_vector);
  return;
}

Assistant:

TEST(test_vector_dense, constructors_initialiser_lists) {
  Vector_Dense<Scalar, 0> dynamic_vector = {1.0, 3.0, 4.0, -8.0};
  EXPECT_EQ(dynamic_vector.size(), 4);
  EXPECT_DOUBLE_EQ(dynamic_vector[0], 1.0);
  EXPECT_DOUBLE_EQ(dynamic_vector[1], 3.0);
  EXPECT_DOUBLE_EQ(dynamic_vector[2], 4.0);
  EXPECT_DOUBLE_EQ(dynamic_vector[3], -8.0);

  Vector_Dense<Scalar, 3> static_vector = {-34.0, 56.0, 23.0};
  EXPECT_DOUBLE_EQ(static_vector[0], -34.0);
  EXPECT_DOUBLE_EQ(static_vector[1], 56.0);
  EXPECT_DOUBLE_EQ(static_vector[2], 23.0);

  EXPECT_DEATH((Vector_Dense<Scalar, 4>({-34.0, 56.0, 23.0})), "./*");
}